

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O0

void __thiscall llbuild::basic::StringList::StringList(StringList *this,StringRef value)

{
  char *pcVar1;
  unsigned_long *puVar2;
  void *pvVar3;
  StringList *this_local;
  StringRef value_local;
  void *P;
  size_t FindBegin;
  char local_21;
  StringList **local_20;
  long local_18;
  StringList **local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (StringList *)value.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  this->size = (uint64_t)(value_local.Data + 1);
  pcVar1 = (char *)operator_new__(this->size);
  this->contents = pcVar1;
  local_20 = &this_local;
  local_21 = '\0';
  FindBegin = 0;
  puVar2 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&value_local);
  pcVar1 = (char *)*puVar2;
  if ((pcVar1 < value_local.Data) &&
     (pvVar3 = memchr(pcVar1 + (long)&this_local->contents,(int)local_21,
                      (long)value_local.Data - (long)pcVar1), pvVar3 != (void *)0x0)) {
    local_18 = (long)pvVar3 - (long)this_local;
  }
  else {
    local_18 = -1;
  }
  if (local_18 != -1) {
    __assert_fail("value.find(\'\\0\') == StringRef::npos",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                  ,0x31,"llbuild::basic::StringList::StringList(StringRef)");
  }
  local_10 = &this_local;
  value_local.Length = (size_t)&this_local;
  memcpy(this->contents,this_local,(size_t)value_local.Data);
  this->contents[this->size - 1] = '\0';
  return;
}

Assistant:

explicit StringList(StringRef value) {
    size = value.size() + 1;
    contents = new char[size];
    assert(value.find('\0') == StringRef::npos);
    memcpy(contents, value.data(), value.size());
    contents[size - 1] = '\0';
  }